

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_child_context(sexp ctx,sexp lambda)

{
  sexp psVar1;
  sexp in_RSI;
  long in_RDI;
  sexp res;
  sexp in_stack_00000018;
  sexp in_stack_00000020;
  sexp in_stack_00000028;
  
  psVar1 = sexp_make_eval_context
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018,(sexp_uint_t)ctx,
                      (sexp_uint_t)lambda);
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    (((psVar1->value).opcode.methods)->value).type.getters = in_RSI;
    (((psVar1->value).type.name)->value).type.cpl = *(sexp *)(*(long *)(in_RDI + 8) + 0x10);
    (((psVar1->value).opcode.methods)->value).type.slots =
         *(sexp *)(*(long *)(in_RDI + 0x50) + 0x18);
    (psVar1->value).flonum_bits[0x60a1] = *(char *)(in_RDI + 0x60a9);
  }
  return psVar1;
}

Assistant:

sexp sexp_make_child_context (sexp ctx, sexp lambda) {
  sexp res = sexp_make_eval_context(ctx,
                                    sexp_context_stack(ctx),
                                    sexp_context_env(ctx),
                                    0,
                                    sexp_context_max_size(ctx));
  if (! sexp_exceptionp(res)) {
    sexp_context_lambda(res) = lambda;
    sexp_context_top(res) = sexp_context_top(ctx);
    sexp_context_fv(res) = sexp_context_fv(ctx);
    sexp_context_tracep(res) = sexp_context_tracep(ctx);
  }
  return res;
}